

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalTableStorage::AppendToIndexes
          (LocalTableStorage *this,DuckTransaction *transaction,TableAppendState *append_state,
          bool append_to_table)

{
  DataTable *this_00;
  RowGroupCollection *pRVar1;
  DataTableInfo *pDVar2;
  type source;
  unsigned_long start_row;
  undefined7 in_register_00000009;
  row_t current_row;
  shared_ptr<duckdb::DataTableInfo,_true> data_table_info;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  ErrorData error;
  
  this_00 = (this->table_ref)._M_data;
  if ((int)CONCAT71(in_register_00000009,append_to_table) == 0) {
    ErrorData::ErrorData(&error);
    ::std::__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)&data_table_info,
               (__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)&this_00->info);
    pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&data_table_info);
    source = shared_ptr<duckdb::RowGroupCollection,_true>::operator*(&this->row_groups);
    DataTable::GetTypes((vector<duckdb::LogicalType,_true> *)&current_row,this_00);
    AppendToIndexes((ErrorData *)&local_138,this,transaction,source,&pDVar2->indexes,
                    (vector<duckdb::LogicalType,_true> *)&current_row,&append_state->current_row);
    ErrorData::operator=(&error,(ErrorData *)&local_138);
    ErrorData::~ErrorData((ErrorData *)&local_138);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&current_row);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&data_table_info.internal.
                super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (error.initialized == true) goto LAB_01accbe7;
  }
  else {
    DataTable::InitializeAppend(this_00,transaction,append_state);
    ErrorData::ErrorData(&error);
    pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
    local_128 = (code *)0x0;
    pcStack_120 = (code *)0x0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_138._M_unused._M_object = operator_new(0x20);
    *(ErrorData **)local_138._M_unused._0_8_ = &error;
    *(DataTable **)((long)local_138._M_unused._0_8_ + 8) = this_00;
    *(LocalTableStorage **)((long)local_138._M_unused._0_8_ + 0x10) = this;
    *(TableAppendState **)((long)local_138._M_unused._0_8_ + 0x18) = append_state;
    pcStack_120 = ::std::
                  _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:183:33)>
                  ::_M_invoke;
    local_128 = ::std::
                _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:183:33)>
                ::_M_manager;
    RowGroupCollection::Scan(pRVar1,transaction,(function<bool_(duckdb::DataChunk_&)> *)&local_138);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_138);
    if (error.initialized != false) {
LAB_01accbe7:
      current_row = append_state->row_start;
      pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
      local_128 = (code *)0x0;
      pcStack_120 = (code *)0x0;
      local_138._M_unused._M_object = (void *)0x0;
      local_138._8_8_ = 0;
      local_138._M_unused._M_object = operator_new(0x20);
      *(DataTable **)local_138._M_unused._0_8_ = this_00;
      *(TableAppendState **)((long)local_138._M_unused._0_8_ + 8) = append_state;
      *(row_t **)((long)local_138._M_unused._0_8_ + 0x10) = &current_row;
      *(ErrorData **)((long)local_138._M_unused._0_8_ + 0x18) = &error;
      pcStack_120 = ::std::
                    _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:203:33)>
                    ::_M_invoke;
      local_128 = ::std::
                  _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:203:33)>
                  ::_M_manager;
      RowGroupCollection::Scan
                (pRVar1,transaction,(function<bool_(duckdb::DataChunk_&)> *)&local_138);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_138);
      if (append_to_table) {
        start_row = NumericCastImpl<unsigned_long,_long,_false>::Convert(append_state->row_start);
        DataTable::RevertAppendInternal(this_00,start_row);
      }
      ::std::__cxx11::string::string
                ((string *)local_138._M_pod_data,anon_var_dwarf_3b2a81b + 9,
                 (allocator *)&data_table_info);
      ErrorData::Throw(&error,(string *)&local_138);
    }
    DataTable::FinalizeAppend(this_00,transaction,append_state);
  }
  ErrorData::~ErrorData(&error);
  return;
}

Assistant:

void LocalTableStorage::AppendToIndexes(DuckTransaction &transaction, TableAppendState &append_state,
                                        bool append_to_table) {
	auto &table = table_ref.get();
	if (append_to_table) {
		table.InitializeAppend(transaction, append_state);
	}
	ErrorData error;
	if (append_to_table) {
		// appending: need to scan entire
		row_groups->Scan(transaction, [&](DataChunk &chunk) -> bool {
			// append this chunk to the indexes of the table
			error = table.AppendToIndexes(delete_indexes, chunk, append_state.current_row, index_append_mode);
			if (error.HasError()) {
				return false;
			}
			// append to base table
			table.Append(chunk, append_state);
			return true;
		});
	} else {
		auto data_table_info = table.GetDataTableInfo();
		auto &index_list = data_table_info->GetIndexes();
		error = AppendToIndexes(transaction, *row_groups, index_list, table.GetTypes(), append_state.current_row);
	}

	if (error.HasError()) {
		// need to revert all appended row ids
		row_t current_row = append_state.row_start;
		// remove the data from the indexes, if there are any indexes
		row_groups->Scan(transaction, [&](DataChunk &chunk) -> bool {
			// Remove this chunk from the indexes.
			try {
				table.RemoveFromIndexes(append_state, chunk, current_row);
			} catch (std::exception &ex) { // LCOV_EXCL_START
				error = ErrorData(ex);
				return false;
			} // LCOV_EXCL_STOP

			current_row += UnsafeNumericCast<row_t>(chunk.size());
			if (current_row >= append_state.current_row) {
				// finished deleting all rows from the index: abort now
				return false;
			}
			return true;
		});
		if (append_to_table) {
			table.RevertAppendInternal(NumericCast<idx_t>(append_state.row_start));
		}
#ifdef DEBUG
		// Verify that our index memory is stable.
		table.VerifyIndexBuffers();
#endif
		error.Throw();
	}
	if (append_to_table) {
		table.FinalizeAppend(transaction, append_state);
	}
}